

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int open_input(char *name)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  int local_ac;
  char local_a8 [4];
  int i;
  char temp [128];
  char *p;
  FILE *fp;
  char *name_local;
  
  if (infile_num == 7) {
    error("Too many include levels, max. 7!");
    name_local._4_4_ = 1;
  }
  else {
    if (infile_num != 0) {
      input_file[infile_num].lnum = slnum;
      input_file[infile_num].fp = in_fp;
    }
    strcpy(local_a8,name);
    temp._120_8_ = strrchr(local_a8,0x2e);
    if ((char *)temp._120_8_ == (char *)0x0) {
      strcat(local_a8,".asm");
    }
    else {
      pcVar2 = strchr((char *)temp._120_8_,0x2f);
      if (pcVar2 != (char *)0x0) {
        strcat(local_a8,".asm");
      }
    }
    if (infile_num != 0) {
      for (local_ac = 1; local_ac < infile_num; local_ac = local_ac + 1) {
        iVar1 = strcmp(input_file[local_ac].name,local_a8);
        if (iVar1 == 0) {
          error("Repeated include file!");
          return 1;
        }
      }
    }
    pFVar3 = open_file(local_a8,"r");
    if (pFVar3 == (FILE *)0x0) {
      name_local._4_4_ = -1;
    }
    else {
      slnum = 0;
      infile_num = infile_num + 1;
      in_fp = pFVar3;
      input_file[infile_num].fp = pFVar3;
      input_file[infile_num].if_level = if_level;
      strcpy(input_file[infile_num].name,local_a8);
      if (((pass == 1) && (xlist != 0)) && (list_level != 0)) {
        fprintf((FILE *)lst_fp,"#[%i]   %s\n",(ulong)(uint)infile_num,
                (long)infile_num * 0x88 + 0x123d70);
      }
      name_local._4_4_ = 0;
    }
  }
  return name_local._4_4_;
}

Assistant:

int
open_input(char *name)
{
	FILE *fp;
	char *p;
	char  temp[128];
	int   i;

	/* only 7 nested input files */
	if (infile_num == 7) {
		error("Too many include levels, max. 7!");
		return (1);
	}

	/* backup current input file infos */
	if (infile_num) {
		input_file[infile_num].lnum = slnum;
		input_file[infile_num].fp = in_fp;
	}				

	/* get a copy of the file name */
	strcpy(temp, name);

	/* auto add the .asm file extension */
	if ((p = strrchr(temp, '.')) != NULL) {
		if (strchr(p, PATH_SEPARATOR))
			strcat(temp, ".asm");
	}
	else {
		strcat(temp, ".asm");
	}

	/* check if this file is already opened */
	if (infile_num) {
		for (i = 1; i < infile_num; i++) {
			if (!strcmp(input_file[i].name, temp)) {
				error("Repeated include file!");
				return (1);
			}
		}
	}				

	/* open the file */
	if ((fp = open_file(temp, "r")) == NULL)
		return (-1);

	/* update input file infos */
	in_fp = fp;
	slnum = 0;
	infile_num++;
	input_file[infile_num].fp = fp;
	input_file[infile_num].if_level = if_level;
	strcpy(input_file[infile_num].name, temp);
	if ((pass == LAST_PASS) && (xlist) && (list_level))
		fprintf(lst_fp, "#[%i]   %s\n", infile_num, input_file[infile_num].name);

	/* ok */
	return (0);
}